

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

AMat4f * aMat4fMul(AMat4f a,AMat4f b)

{
  AMat4f *in_RDI;
  int local_28;
  int local_24;
  int col;
  int row;
  float *result;
  float *rows;
  float *cols;
  
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      (&aMat4fMul::m.X.x)[local_24 + local_28 * 4] =
           (&a.W.z)[local_28 * 4 + 3] * *(float *)(&stack0x00000008 + (long)(local_24 + 0xc) * 4) +
           (&a.W.z)[local_28 * 4 + 2] * *(float *)(&stack0x00000008 + (long)(local_24 + 8) * 4) +
           (&a.W.z)[local_28 << 2] * *(float *)(&stack0x00000008 + (long)local_24 * 4) +
           (&a.W.z)[local_28 * 4 + 1] * *(float *)(&stack0x00000008 + (long)(local_24 + 4) * 4);
    }
  }
  memcpy(in_RDI,&aMat4fMul::m,0x40);
  return in_RDI;
}

Assistant:

static inline AMat4f aMat4fMul(AMat4f a, AMat4f b) {
	const float *cols = &b.X.x, *rows = &a.X.x;
	static AMat4f m;
	float *result = &m.X.x;
	for (int row = 0; row < 4; ++row)
		for (int col = 0; col < 4; ++col) {
			result[row + col * 4] = cols[col * 4 + 0] * rows[row + 0] + cols[col * 4 + 1] * rows[row + 4] +
				cols[col * 4 + 2] * rows[row + 8] + cols[col * 4 + 3] * rows[row + 12];
		}
	return m;
}